

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void btf_16_avx2(__m256i *w0,__m256i *w1,__m256i *in0,__m256i *in1,__m128i *out0,__m128i *out1,
                __m128i *out2,__m128i *out3,__m256i *__rounding,int8_t *cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined8 *in_R8;
  undefined8 *in_R9;
  long in_stack_00000008;
  __m256i d1;
  __m256i d0;
  __m256i c1;
  __m256i c0;
  __m256i b1;
  __m256i b0;
  __m256i a1;
  __m256i a0;
  __m256i v1;
  __m256i v0;
  __m256i u1;
  __m256i u0;
  __m256i t1;
  __m256i t0;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  longlong lStack_6b0;
  longlong lStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  
  auVar4 = vpunpcklwd_avx2(*in_RDX,*in_RCX);
  auVar3 = vpunpckhwd_avx2(*in_RDX,*in_RCX);
  auVar1 = vpmaddwd_avx2(auVar4,*in_RDI);
  auVar2 = vpmaddwd_avx2(auVar3,*in_RDI);
  auVar4 = vpmaddwd_avx2(auVar4,*in_RSI);
  auVar3 = vpmaddwd_avx2(auVar3,*in_RSI);
  auVar1 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])out3);
  auVar2 = vpaddd_avx2(auVar2,*(undefined1 (*) [32])out3);
  auVar4 = vpaddd_avx2(auVar4,*(undefined1 (*) [32])out3);
  auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])out3);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416((uint)(int)(char)(*__rounding)[0]));
  auVar2 = vpsrad_avx2(auVar2,ZEXT416((uint)(int)(char)(*__rounding)[0]));
  auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)(int)(char)(*__rounding)[0]));
  auVar3 = vpsrad_avx2(auVar3,ZEXT416((uint)(int)(char)(*__rounding)[0]));
  auVar1 = vpackssdw_avx2(auVar1,auVar2);
  auVar2 = vpackssdw_avx2(auVar4,auVar3);
  local_6a0 = auVar1._0_8_;
  uStack_698 = auVar1._8_8_;
  *in_R8 = local_6a0;
  in_R8[1] = uStack_698;
  local_6c0 = auVar2._0_8_;
  uStack_6b8 = auVar2._8_8_;
  lStack_6b0 = auVar2._16_8_;
  lStack_6a8 = auVar2._24_8_;
  *in_R9 = local_6c0;
  in_R9[1] = uStack_6b8;
  uStack_688 = auVar1._24_8_;
  uStack_690 = auVar1._16_8_;
  *(undefined8 *)(in_stack_00000008 + 0x10) = uStack_690;
  *(undefined8 *)(in_stack_00000008 + 0x18) = uStack_688;
  (*out2)[0] = lStack_6b0;
  (*out2)[1] = lStack_6a8;
  return;
}

Assistant:

static inline void btf_16_avx2(__m256i *w0, __m256i *w1, __m256i *in0,
                               __m256i *in1, __m128i *out0, __m128i *out1,
                               __m128i *out2, __m128i *out3,
                               const __m256i *__rounding, int8_t *cos_bit) {
  __m256i t0 = _mm256_unpacklo_epi16(*in0, *in1);
  __m256i t1 = _mm256_unpackhi_epi16(*in0, *in1);
  __m256i u0 = _mm256_madd_epi16(t0, *w0);
  __m256i u1 = _mm256_madd_epi16(t1, *w0);
  __m256i v0 = _mm256_madd_epi16(t0, *w1);
  __m256i v1 = _mm256_madd_epi16(t1, *w1);

  __m256i a0 = _mm256_add_epi32(u0, *__rounding);
  __m256i a1 = _mm256_add_epi32(u1, *__rounding);
  __m256i b0 = _mm256_add_epi32(v0, *__rounding);
  __m256i b1 = _mm256_add_epi32(v1, *__rounding);

  __m256i c0 = _mm256_srai_epi32(a0, *cos_bit);
  __m256i c1 = _mm256_srai_epi32(a1, *cos_bit);
  __m256i d0 = _mm256_srai_epi32(b0, *cos_bit);
  __m256i d1 = _mm256_srai_epi32(b1, *cos_bit);

  __m256i temp0 = _mm256_packs_epi32(c0, c1);
  __m256i temp1 = _mm256_packs_epi32(d0, d1);

  *out0 = _mm256_castsi256_si128(temp0);
  *out1 = _mm256_castsi256_si128(temp1);
  *out2 = _mm256_extracti128_si256(temp0, 0x01);
  *out3 = _mm256_extracti128_si256(temp1, 0x01);
}